

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_executor.cpp
# Opt level: O2

Value * duckdb::ExpressionExecutor::EvaluateScalar
                  (Value *__return_storage_ptr__,ClientContext *context,Expression *expr,
                  bool allow_unfoldable)

{
  ExpressionExecutor executor;
  Vector result;
  LogicalType LStack_d8;
  ExpressionExecutor local_c0;
  Vector local_78;
  
  ExpressionExecutor(&local_c0,context,expr);
  LogicalType::LogicalType(&LStack_d8,&expr->return_type);
  Vector::Vector(&local_78,&LStack_d8,0x800);
  LogicalType::~LogicalType(&LStack_d8);
  ExecuteExpression(&local_c0,&local_78);
  Vector::GetValue(__return_storage_ptr__,&local_78,0);
  Vector::~Vector(&local_78);
  ~ExpressionExecutor(&local_c0);
  return __return_storage_ptr__;
}

Assistant:

Value ExpressionExecutor::EvaluateScalar(ClientContext &context, const Expression &expr, bool allow_unfoldable) {
	D_ASSERT(allow_unfoldable || expr.IsFoldable());
	D_ASSERT(expr.IsScalar());
	// use an ExpressionExecutor to execute the expression
	ExpressionExecutor executor(context, expr);

	Vector result(expr.return_type);
	executor.ExecuteExpression(result);

	D_ASSERT(allow_unfoldable || result.GetVectorType() == VectorType::CONSTANT_VECTOR);
	auto result_value = result.GetValue(0);
	D_ASSERT(result_value.type().InternalType() == expr.return_type.InternalType());
	return result_value;
}